

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineMapper.h
# Opt level: O1

void anurbs::PolylineMapper<3L>::register_python(module *m)

{
  string name;
  class_<anurbs::PolylineMapper<3L>_> cStack_78;
  long *local_70;
  long local_60 [2];
  arg local_50;
  code *local_40;
  undefined8 local_38;
  arg local_30;
  arg local_20;
  
  PolylineMapper<3l>::python_name_abi_cxx11_();
  pybind11::class_<anurbs::PolylineMapper<3L>_>::class_<>
            (&cStack_78,(m->super_object).super_handle.m_ptr,(char *)local_70);
  local_20.name = "points";
  local_20._8_1_ = 2;
  pybind11::class_<anurbs::PolylineMapper<3L>_>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg>
            (&cStack_78,"__init__",(type *)&local_40,(is_new_style_constructor *)&local_50,&local_20
            );
  local_40 = map;
  local_38 = 0;
  local_50.name = "point";
  local_50._8_1_ = 2;
  local_30.name = "tolerance";
  local_30._8_1_ = 2;
  pybind11::class_<anurbs::PolylineMapper<3l>>::
  def<std::tuple<double,long,double,long>(anurbs::PolylineMapper<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,double),pybind11::arg,pybind11::arg>
            ((class_<anurbs::PolylineMapper<3l>> *)&cStack_78,"map",
             (offset_in_Model_to_subr *)&local_40,&local_50,&local_30);
  pybind11::object::~object((object *)&cStack_78);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        const std::string name = Type::python_name();

        py::class_<Type>(m, name.c_str())
            // constructors
            .def(py::init<const std::vector<Vector>&>(), "points"_a)
            // methods
            .def("map", &Type::map, "point"_a, "tolerance"_a)
        ;
    }